

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChDampingReissnerRayleigh::ChDampingReissnerRayleigh
          (ChDampingReissnerRayleigh *this,
          shared_ptr<chrono::fea::ChElasticityReissner> *melasticity,double *mbeta)

{
  (this->super_ChDampingReissner).section = (ChMaterialShellReissner *)0x0;
  (this->super_ChDampingReissner)._vptr_ChDampingReissner =
       (_func_int **)&PTR__ChDampingReissnerRayleigh_00b537e0;
  (this->section_elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->section_elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->beta = *mbeta;
  (this->section_elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (melasticity->
       super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->section_elasticity).
              super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(melasticity->
              super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  this->updated = false;
  return;
}

Assistant:

ChDampingReissnerRayleigh::ChDampingReissnerRayleigh(
									std::shared_ptr<ChElasticityReissner> melasticity, 
									const double& mbeta) {
	this->beta = mbeta;
	this->section_elasticity = melasticity;
	this->updated = false;
}